

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

int match_tzofs(date_parse_result *res,char **str,size_t *len)

{
  char cVar1;
  char *pcVar2;
  int32_t gmtofs_secs;
  int iVar3;
  int iVar4;
  CVmTimeZone *pCVar5;
  char *p;
  size_t rem;
  int ss;
  int mi;
  int hh;
  char *local_60;
  size_t local_58;
  int local_4c;
  int local_48;
  int local_44;
  date_parse_string local_40;
  
  local_60 = *str;
  local_58 = *len;
  iVar3 = match_lit(&local_60,&local_58,"^GMT",4,&local_40);
  if (local_58 == 0) {
    return 0;
  }
  cVar1 = *local_60;
  if ((cVar1 != '-') && (cVar1 != '+')) {
    return 0;
  }
  local_60 = local_60 + 1;
  local_58 = local_58 - 1;
  iVar4 = match_digits(&local_44,&local_60,&local_58,"0509",&local_40);
  if (iVar4 == 0) {
    if (iVar3 == 0) {
      return 0;
    }
    iVar3 = match_digits(&local_44,&local_60,&local_58,"09",&local_40);
    if (iVar3 == 0) {
      return 0;
    }
  }
  local_48 = 0;
  if ((local_58 == 0) || (*local_60 != ':')) {
    match_digits(&local_48,&local_60,&local_58,"0509",&local_40);
LAB_00286442:
    local_4c = 0;
    if ((local_58 == 0) || (*local_60 != ':')) {
      match_digits(&local_4c,&local_60,&local_58,"0509",&local_40);
    }
    else {
      local_60 = local_60 + 1;
      local_58 = local_58 - 1;
      iVar3 = match_digits(&local_4c,&local_60,&local_58,"0509",&local_40);
      if (iVar3 == 0) goto LAB_0028648e;
    }
    iVar3 = local_48 * 0x3c + local_44 * 0xe10 + local_4c;
    gmtofs_secs = -iVar3;
    if (cVar1 == '+') {
      gmtofs_secs = iVar3;
    }
    pCVar5 = CVmTimeZoneCache::get_gmtofs_zone(G_tzcache_X,gmtofs_secs);
    res->tz = pCVar5;
    res->tzofs = gmtofs_secs * 1000;
    pcVar2 = *str;
    (res->ptz).p = pcVar2;
    (res->ptz).len = (long)local_60 - (long)pcVar2;
    *str = local_60;
    *len = local_58;
    iVar3 = 1;
  }
  else {
    local_60 = local_60 + 1;
    local_58 = local_58 - 1;
    iVar3 = match_digits(&local_48,&local_60,&local_58,"0509",&local_40);
    if (iVar3 != 0) goto LAB_00286442;
LAB_0028648e:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int match_tzofs(VMG_ date_parse_result *res,
                       const char *&str, size_t &len)
{
    const char *p = str;
    size_t rem = len;

    /* first, skip "gmt" if present */
    date_parse_string part;
    int gmtlit = match_lit(p, rem, "^GMT", part);

    /* get the sign */
    if (rem == 0 || (*p != '+' && *p != '-'))
        return FALSE;
    int s = (*p == '+' ? 1 : -1);

    /* skip the sign */
    ++p, --rem;

    /* 
     *   Get the "hh".  If the "GMT" literal was present, allow a single
     *   digit; otherwise require the two-digit format. 
     */
    int hh;
    if (!match_digits(hh, p, rem, "0509", part)
        && (!gmtlit || !match_digits(hh, p, rem, "09", part)))
        return FALSE;

    /* 
     *   check for ":" - if present, the minutes must be present, otherwise
     *   they're optional 
     */
    int mi = 0;
    if (rem != 0 && *p == ':')
    {
        /* skip the ":", then require the minutes */
        ++p, --rem;
        if (!match_digits(mi, p, rem, "0509", part))
            return FALSE;
    }
    else
    {
        /* no ":", so the minuts are optional */
        match_digits(mi, p, rem, "0509", part);
    }

    /* likewise, check for ":ss" */
    int ss = 0;
    if (rem != 0 && *p == ':')
    {
        ++p, --rem;
        if (!match_digits(ss, p, rem, "0509", part))
            return FALSE;
    }
    else
    {
        match_digits(ss, p, rem, "0509", part);
    }

    /* success - figure the offset in seconds */
    int32_t ofs = s * ((hh*60*60) + (mi*60) + ss);

    /* look up the zone by offset */
    res->tz = G_tzcache->get_gmtofs_zone(vmg_ ofs);

    /* also set the explicit offset value (in milliseconds) */
    res->tzofs = ofs * 1000;

    /* set the capture data */
    res->ptz.p = str;
    res->ptz.len = p - str;

    /* advance the caller's vars past the parsed tzofs and return success */
    str = p;
    len = rem;
    return TRUE;
}